

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search_entityrelationtask.cc
# Opt level: O0

void EntityRelationTask::er_allow_skip_decoding
               (search *sch,multi_ex *ec,v_array<unsigned_long> *predictions)

{
  ulong i_00;
  bool bVar1;
  task_data *ptVar2;
  ulong uVar3;
  size_type sVar4;
  unsigned_long *puVar5;
  v_array<unsigned_long> *in_RDX;
  vector<example_*,_std::allocator<example_*>_> *in_RSI;
  search *in_RDI;
  __type_conflict _Var6;
  size_t prediction;
  ptag i;
  ptag t;
  size_t p_n_predicts;
  size_t n_predicts;
  bool must_predict;
  size_t n_ent;
  task_data *my_task_data;
  undefined1 in_stack_0000031b;
  ptag in_stack_0000031c;
  v_array<unsigned_long> *in_stack_00000320;
  example *in_stack_00000328;
  search *in_stack_00000330;
  undefined1 in_stack_000003fb;
  ptag in_stack_000003fc;
  v_array<unsigned_long> *in_stack_00000400;
  example *in_stack_00000408;
  search *in_stack_00000410;
  size_t local_50;
  uint local_44;
  size_type local_40;
  size_type local_38;
  
  ptVar2 = Search::search::get_task_data<EntityRelationTask::task_data>(in_RDI);
  std::vector<example_*,_std::allocator<example_*>_>::size(in_RSI);
  _Var6 = std::sqrt<unsigned_long>(0x3e7e92);
  uVar3 = (ulong)(_Var6 + -1.0);
  bVar1 = false;
  local_38 = 0;
  local_40 = 0;
  ptVar2->allow_skip = true;
  local_44 = 0;
  while( true ) {
    sVar4 = std::vector<example_*,_std::allocator<example_*>_>::size(in_RSI);
    i_00 = (ulong)local_44 % (sVar4 & 0xffffffff);
    sVar4 = std::vector<example_*,_std::allocator<example_*>_>::size(in_RSI);
    if (local_38 == sVar4) break;
    puVar5 = v_array<unsigned_long>::operator[](in_RDX,i_00);
    if (*puVar5 == 0) {
      if (bVar1) {
        ptVar2->allow_skip = false;
      }
      if (i_00 < (uVar3 | (long)((_Var6 + -1.0) - 9.223372036854776e+18) & (long)uVar3 >> 0x3f) >> 1
         ) {
        std::vector<example_*,_std::allocator<example_*>_>::operator[](in_RSI,i_00);
        local_50 = predict_entity(in_stack_00000330,in_stack_00000328,in_stack_00000320,
                                  in_stack_0000031c,(bool)in_stack_0000031b);
      }
      else {
        std::vector<example_*,_std::allocator<example_*>_>::operator[](in_RSI,i_00);
        local_50 = predict_relation(in_stack_00000410,in_stack_00000408,in_stack_00000400,
                                    in_stack_000003fc,(bool)in_stack_000003fb);
      }
      if (local_50 != 0xb) {
        puVar5 = v_array<unsigned_long>::operator[](in_RDX,i_00);
        *puVar5 = local_50;
        local_38 = local_38 + 1;
      }
      if (bVar1) {
        ptVar2->allow_skip = true;
        bVar1 = false;
      }
    }
    sVar4 = std::vector<example_*,_std::allocator<example_*>_>::size(in_RSI);
    if (i_00 == sVar4 - 1) {
      if (local_38 == local_40) {
        bVar1 = true;
      }
      local_40 = local_38;
    }
    local_44 = local_44 + 1;
  }
  return;
}

Assistant:

void er_allow_skip_decoding(Search::search& sch, multi_ex& ec, v_array<size_t>& predictions)
{
  task_data* my_task_data = sch.get_task_data<task_data>();
  // ec.size = #entity + #entity*(#entity-1)/2
  size_t n_ent = (size_t)(sqrt(ec.size() * 8 + 1) - 1) / 2;

  bool must_predict = false;
  size_t n_predicts = 0;
  size_t p_n_predicts = 0;
  my_task_data->allow_skip = true;

  // loop until all the entity and relation types are predicted
  for (ptag t = 0;; t++)
  {
    ptag i = t % (uint32_t)ec.size();
    if (n_predicts == ec.size())
      break;

    if (predictions[i] == 0)
    {
      if (must_predict)
      {
        my_task_data->allow_skip = false;
      }
      size_t prediction = 0;
      if (i < n_ent)  // do entity recognition
      {
        prediction = predict_entity(sch, ec[i], predictions, i);
      }
      else  // do relation recognition
      {
        prediction = predict_relation(sch, ec[i], predictions, i);
      }

      if (prediction != LABEL_SKIP)
      {
        predictions[i] = prediction;
        n_predicts++;
      }

      if (must_predict)
      {
        my_task_data->allow_skip = true;
        must_predict = false;
      }
    }

    if (i == ec.size() - 1)
    {
      if (n_predicts == p_n_predicts)
      {
        must_predict = true;
      }
      p_n_predicts = n_predicts;
    }
  }
}